

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *in_RSI;
  bool bVar3;
  int value;
  stbi__context *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar2 = stbi__at_eof(in_stack_ffffffffffffffd8);
    bVar3 = false;
    if (iVar2 == 0) {
      iVar2 = stbi__pnm_isdigit(*in_RSI);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    local_1c = local_1c * 10 + (char)*in_RSI + -0x30;
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    *in_RSI = sVar1;
    if ((0xccccccc < local_1c) || ((local_1c == 0xccccccc && ('7' < (char)*in_RSI)))) {
      iVar2 = stbi__err("integer parse overflow");
      return iVar2;
    }
  }
  return local_1c;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
      if((value > 214748364) || (value == 214748364 && *c > '7'))
          return stbi__err("integer parse overflow", "Parsing an integer in the PPM header overflowed a 32-bit int");
   }

   return value;
}